

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::SymbolsWrapper::doCopyFrom(SymbolsWrapper *this,SymbolsWrapper *other)

{
  SymbolsPointerType SVar1;
  DecimalFormatSymbols *pDVar2;
  DecimalFormatSymbols *local_68;
  DecimalFormatSymbols *local_58;
  SymbolsWrapper *other_local;
  SymbolsWrapper *this_local;
  
  this->fType = other->fType;
  SVar1 = this->fType;
  if (SVar1 != SYMPTR_NONE) {
    if (SVar1 == SYMPTR_DFS) {
      if ((other->fPtr).dfs == (DecimalFormatSymbols *)0x0) {
        (this->fPtr).dfs = (DecimalFormatSymbols *)0x0;
      }
      else {
        pDVar2 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)other);
        local_58 = (DecimalFormatSymbols *)0x0;
        if (pDVar2 != (DecimalFormatSymbols *)0x0) {
          DecimalFormatSymbols::DecimalFormatSymbols(pDVar2,(other->fPtr).dfs);
          local_58 = pDVar2;
        }
        (this->fPtr).dfs = local_58;
      }
    }
    else if (SVar1 == SYMPTR_NS) {
      if ((other->fPtr).dfs == (DecimalFormatSymbols *)0x0) {
        (this->fPtr).dfs = (DecimalFormatSymbols *)0x0;
      }
      else {
        pDVar2 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0x58,(size_t)other);
        local_68 = (DecimalFormatSymbols *)0x0;
        if (pDVar2 != (DecimalFormatSymbols *)0x0) {
          NumberingSystem::NumberingSystem((NumberingSystem *)pDVar2,(other->fPtr).ns);
          local_68 = pDVar2;
        }
        (this->fPtr).dfs = local_68;
      }
    }
  }
  return;
}

Assistant:

void SymbolsWrapper::doCopyFrom(const SymbolsWrapper& other) {
    fType = other.fType;
    switch (fType) {
        case SYMPTR_NONE:
            // No action necessary
            break;
        case SYMPTR_DFS:
            // Memory allocation failures are exposed in copyErrorTo()
            if (other.fPtr.dfs != nullptr) {
                fPtr.dfs = new DecimalFormatSymbols(*other.fPtr.dfs);
            } else {
                fPtr.dfs = nullptr;
            }
            break;
        case SYMPTR_NS:
            // Memory allocation failures are exposed in copyErrorTo()
            if (other.fPtr.ns != nullptr) {
                fPtr.ns = new NumberingSystem(*other.fPtr.ns);
            } else {
                fPtr.ns = nullptr;
            }
            break;
    }
}